

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O2

int gost_grasshopper_cipher_do_ctracpkm(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  byte bVar1;
  grasshopper_w128_t *pgVar2;
  grasshopper_w128_t *pgVar3;
  grasshopper_w128_t *x;
  uint uVar4;
  gost_grasshopper_cipher_ctx_ctr *pgVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  grasshopper_w128_t tmp;
  uint local_94;
  grasshopper_w128_t *local_90;
  grasshopper_w128_t *local_88;
  ulong local_80;
  grasshopper_w128_t *local_78;
  grasshopper_round_keys_t *local_70;
  gost_grasshopper_cipher_ctx_ctr *local_68;
  grasshopper_w128_t *local_60;
  EVP_CIPHER_CTX *local_58;
  size_t local_50;
  ulong local_48;
  grasshopper_w128_t local_40;
  
  pgVar5 = (gost_grasshopper_cipher_ctx_ctr *)EVP_CIPHER_CTX_get_cipher_data();
  local_68 = pgVar5;
  local_90 = (grasshopper_w128_t *)EVP_CIPHER_CTX_iv_noconst(ctx);
  local_58 = ctx;
  local_94 = EVP_CIPHER_CTX_get_num(ctx);
  pgVar2 = local_90;
  local_78 = &pgVar5->partial_buffer;
  local_80 = inl;
  while( true ) {
    if (((local_94 & 0xf) == 0) || (local_80 == 0)) break;
    bVar1 = *in;
    in = in + 1;
    *out = local_78->b[local_94 & 0xf] ^ bVar1;
    out = out + 1;
    local_94 = local_94 + 1;
    local_80 = local_80 - 1;
  }
  local_48 = local_80 >> 4;
  local_70 = &(pgVar5->c).encrypt_round_keys;
  local_60 = &(pgVar5->c).buffer;
  uVar8 = 0;
  local_88 = (grasshopper_w128_t *)in;
  local_50 = inl;
  for (uVar7 = 0; uVar7 < local_48; uVar7 = uVar7 + 1) {
    apply_acpkm_grasshopper(local_68,&local_94);
    x = local_78;
    grasshopper_encrypt_block(local_70,pgVar2,local_78,local_60);
    pgVar3 = local_88;
    grasshopper_plus128(&local_40,x,local_88);
    grasshopper_copy128((grasshopper_w128_t *)out,&local_40);
    ctr128_inc(pgVar2->b);
    local_88 = pgVar3 + 1;
    out = (uchar *)((long)out + 0x10);
    local_94 = local_94 + 0x10;
    uVar8 = uVar8 + 0x10;
  }
  uVar7 = local_80 - uVar8;
  uVar4 = local_94;
  if (local_80 != uVar8) {
    apply_acpkm_grasshopper(local_68,&local_94);
    pgVar2 = local_78;
    grasshopper_encrypt_block(local_70,local_90,local_78,local_60);
    for (uVar6 = 0; uVar6 < uVar7; uVar6 = uVar6 + 1) {
      out[uVar6] = local_88->b[uVar6] ^ pgVar2->b[uVar6];
    }
    ctr128_inc(local_90->b);
    uVar4 = ((int)local_80 + local_94) - (int)uVar8;
  }
  EVP_CIPHER_CTX_set_num(local_58,uVar4);
  return (int)local_50;
}

Assistant:

static int gost_grasshopper_cipher_do_ctracpkm(EVP_CIPHER_CTX *ctx,
                                               unsigned char *out,
                                               const unsigned char *in,
                                               size_t inl)
{
    gost_grasshopper_cipher_ctx_ctr *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
    unsigned int num = EVP_CIPHER_CTX_num(ctx);
    size_t blocks, i, lasted = inl;
    grasshopper_w128_t tmp;

    while ((num & GRASSHOPPER_BLOCK_MASK) && lasted) {
        *out++ = *in++ ^ c->partial_buffer.b[num & GRASSHOPPER_BLOCK_MASK];
        --lasted;
        num++;
    }
    blocks = lasted / GRASSHOPPER_BLOCK_SIZE;

    // full parts
    for (i = 0; i < blocks; i++) {
        apply_acpkm_grasshopper(c, &num);
        grasshopper_encrypt_block(&c->c.encrypt_round_keys,
                                  (grasshopper_w128_t *) iv,
                                  (grasshopper_w128_t *) & c->partial_buffer,
                                  &c->c.buffer);
        grasshopper_plus128(&tmp, &c->partial_buffer,
                            (grasshopper_w128_t *) in);
        grasshopper_copy128((grasshopper_w128_t *) out, &tmp);
        ctr128_inc(iv);
        in += GRASSHOPPER_BLOCK_SIZE;
        out += GRASSHOPPER_BLOCK_SIZE;
        num += GRASSHOPPER_BLOCK_SIZE;
        lasted -= GRASSHOPPER_BLOCK_SIZE;
    }

    // last part
    if (lasted > 0) {
        apply_acpkm_grasshopper(c, &num);
        grasshopper_encrypt_block(&c->c.encrypt_round_keys,
                                  (grasshopper_w128_t *) iv,
                                  &c->partial_buffer, &c->c.buffer);
        for (i = 0; i < lasted; i++)
            out[i] = c->partial_buffer.b[i] ^ in[i];
        ctr128_inc(iv);
        num += lasted;
    }
    EVP_CIPHER_CTX_set_num(ctx, num);

    return inl;
}